

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PrintVisitor.cpp
# Opt level: O0

void __thiscall PrintVisitor::visit(PrintVisitor *this,BinaryOpNode *node)

{
  ostream *poVar1;
  ExpressionNode *pEVar2;
  mapped_type *pmVar3;
  BinaryOpNode *in_RSI;
  long in_RDI;
  PrintVisitor visitor;
  key_type *in_stack_ffffffffffffff28;
  unordered_map<BinaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<BinaryOperator>,_std::equal_to<BinaryOperator>,_std::allocator<std::pair<const_BinaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff30;
  ostream *in_stack_ffffffffffffff38;
  PrintVisitor *in_stack_ffffffffffffff40;
  PrintVisitor *in_stack_ffffffffffffff58;
  PrintVisitor *this_00;
  string local_78 [32];
  undefined1 local_58 [40];
  string local_30 [32];
  BinaryOpNode *local_10;
  
  poVar1 = *(ostream **)(in_RDI + 8);
  local_10 = in_RSI;
  indent_abi_cxx11_(in_stack_ffffffffffffff58);
  poVar1 = std::operator<<(poVar1,local_30);
  std::operator<<(poVar1,"BinaryOpNode:\n");
  std::__cxx11::string::~string(local_30);
  PrintVisitor(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
               (uint)((ulong)in_stack_ffffffffffffff30 >> 0x20));
  pEVar2 = BinaryOpNode::getLeftOperand((BinaryOpNode *)0x13793d);
  (*(pEVar2->super_Node)._vptr_Node[2])(pEVar2,local_58);
  this_00 = *(PrintVisitor **)(in_RDI + 8);
  indent_abi_cxx11_(this_00);
  poVar1 = std::operator<<((ostream *)this_00,local_78);
  BinaryOpNode::getOperation(local_10);
  pmVar3 = std::
           unordered_map<BinaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<BinaryOperator>,_std::equal_to<BinaryOperator>,_std::allocator<std::pair<const_BinaryOperator,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  poVar1 = std::operator<<(poVar1,(string *)pmVar3);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_78);
  pEVar2 = BinaryOpNode::getRightOperand((BinaryOpNode *)0x1379f8);
  (*(pEVar2->super_Node)._vptr_Node[2])(pEVar2,local_58);
  ~PrintVisitor((PrintVisitor *)0x137a24);
  return;
}

Assistant:

void PrintVisitor::visit(const BinaryOpNode& node)
{
  stream_ << indent() << "BinaryOpNode:\n";
  auto visitor = PrintVisitor{stream_, indentation_ + 1};
  node.getLeftOperand().accept(visitor);
  stream_ << indent() << BinaryOperationNames.at(node.getOperation()) << "\n";
  node.getRightOperand().accept(visitor);
}